

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffrsim(fitsfile *fptr,int bitpix,int naxis,long *naxes,int *status)

{
  long in_RCX;
  int in_EDX;
  int *in_R8;
  int ii;
  LONGLONG tnaxes [99];
  int local_34c;
  undefined8 local_348 [100];
  int *local_28;
  long local_20;
  int local_18;
  int local_4;
  
  if (*in_R8 < 1) {
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_EDX;
    for (local_34c = 0; local_34c < local_18 && local_34c < 99; local_34c = local_34c + 1) {
      local_348[local_34c] = *(undefined8 *)(local_20 + (long)local_34c * 8);
    }
    ffrsimll((fitsfile *)tnaxes[0x2a],tnaxes[0x29]._4_4_,(int)tnaxes[0x29],(LONGLONG *)tnaxes[0x28],
             (int *)tnaxes[0x27]);
    local_4 = *local_28;
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffrsim(fitsfile *fptr,      /* I - FITS file pointer           */
           int bitpix,          /* I - bits per pixel              */
           int naxis,           /* I - number of axes in the array */
           long *naxes,         /* I - size of each axis           */
           int *status)         /* IO - error status               */
/*
   resize an existing primary array or IMAGE extension.
*/
{
    LONGLONG tnaxes[99];
    int ii;
    
    if (*status > 0)
        return(*status);

    for (ii = 0; (ii < naxis) && (ii < 99); ii++)
        tnaxes[ii] = naxes[ii];

    ffrsimll(fptr, bitpix, naxis, tnaxes, status);

    return(*status);
}